

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

bool __thiscall PrintableString::SetValue(PrintableString *this,char *str)

{
  int iVar1;
  char *local_28;
  char *tmp;
  char *str_local;
  PrintableString *this_local;
  
  local_28 = str;
  if (str == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    for (; *local_28 != '\0'; local_28 = local_28 + 1) {
      iVar1 = isalnum((int)*local_28);
      if ((((iVar1 == 0) && (iVar1 = (int)*local_28, iVar1 != 0x20)) && (2 < iVar1 - 0x27U)) &&
         (((4 < iVar1 - 0x2bU && (iVar1 != 0x3a)) && ((iVar1 != 0x3d && (iVar1 != 0x3f)))))) {
        return false;
      }
    }
    std::__cxx11::string::operator=((string *)&this->value,str);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PrintableString::SetValue(const char * str)
{
	const char* tmp = str;
	if (str == nullptr)
		return false;

	for (; *tmp != '\0'; ++tmp)
	{
		if (!isalnum(*tmp))
		{
			switch (*tmp)
			{
			case ' ':
			case '\'':
			case '(':
			case ')':
			case '+':
			case ',':
			case '-':
			case '.':
			case '/':
			case ':':
			case '=':
			case '?':
				break;
			default:
				return false;
			}
		}
	}

	value = str;
	return true;
}